

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O3

void __thiscall csv::internals::IBasicCSVParser::trim_utf8_bom(IBasicCSVParser *this)

{
  element_type *peVar1;
  char *pcVar2;
  
  if ((this->unicode_bom_scan == false) &&
     (peVar1 = (this->data_ptr).
               super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     2 < (peVar1->data)._M_len)) {
    pcVar2 = (peVar1->data)._M_str;
    if ((*pcVar2 == -0x11) && ((pcVar2[1] == -0x45 && (pcVar2[2] == -0x41)))) {
      this->data_pos = this->data_pos + 3;
      this->_utf8_bom = true;
    }
    this->unicode_bom_scan = true;
  }
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::trim_utf8_bom() {
            auto& data = this->data_ptr->data;

            if (!this->unicode_bom_scan && data.size() >= 3) {
                if (data[0] == '\xEF' && data[1] == '\xBB' && data[2] == '\xBF') {
                    this->data_pos += 3; // Remove BOM from input string
                    this->_utf8_bom = true;
                }

                this->unicode_bom_scan = true;
            }
        }